

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodel.h
# Opt level: O1

Value * Value::string(Value *__return_storage_ptr__,string *sval)

{
  (__return_storage_ptr__->stringValue)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->stringValue).field_2;
  (__return_storage_ptr__->stringValue)._M_string_length = 0;
  (__return_storage_ptr__->stringValue).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->bindingValue).super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->bindingValue).super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->type = 2;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static Value string(const std::string &sval) {
        Value v;
        v.type = StringValue;
        v.stringValue = sval;
        return v;
    }